

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O3

WebPMuxError MuxGetCanvasInfo(WebPMux *mux,int *width,int *height,uint32_t *flags)

{
  uint32_t *puVar1;
  WebPMuxImage *wpi_list;
  int iVar2;
  int iVar3;
  WebPMuxError WVar4;
  WebPChunk *pWVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  
  pWVar5 = ChunkSearchList(mux->vp8x_,1,0x58385056);
  if (pWVar5 != (WebPChunk *)0x0) {
    if ((pWVar5->data_).size < 10) {
      return WEBP_MUX_BAD_DATA;
    }
    puVar1 = (uint32_t *)(pWVar5->data_).bytes;
    uVar7 = *puVar1;
    iVar8 = (uint)*(byte *)((long)puVar1 + 6) * 0x10000 + (uint)(ushort)puVar1[1] + 1;
    iVar6 = (uint)*(ushort *)((long)puVar1 + 7) + (uint)*(byte *)((long)puVar1 + 9) * 0x10000 + 1;
    goto LAB_0014f83a;
  }
  wpi_list = mux->images_;
  iVar8 = mux->canvas_width_;
  iVar6 = mux->canvas_height_;
  if (mux->canvas_height_ == 0 && iVar8 == 0) {
    iVar2 = MuxImageCount(wpi_list,WEBP_CHUNK_IMAGE);
    iVar3 = MuxImageCount(mux->images_,WEBP_CHUNK_ANMF);
    iVar6 = 0;
    if ((iVar2 != 1) || (iVar6 = 0, iVar3 != 0)) goto LAB_0014f823;
    iVar8 = wpi_list->width_;
    iVar6 = wpi_list->height_;
  }
  else {
LAB_0014f823:
    if (wpi_list == (WebPMuxImage *)0x0) {
      uVar7 = 0;
      goto LAB_0014f83a;
    }
  }
  uVar7 = (uint)(wpi_list->has_alpha_ != 0) << 4;
LAB_0014f83a:
  WVar4 = WEBP_MUX_BAD_DATA;
  if ((ulong)((long)iVar6 * (long)iVar8) >> 0x20 == 0) {
    if (width != (int *)0x0) {
      *width = iVar8;
    }
    if (height != (int *)0x0) {
      *height = iVar6;
    }
    WVar4 = WEBP_MUX_OK;
    if (flags != (uint32_t *)0x0) {
      *flags = uVar7;
    }
  }
  return WVar4;
}

Assistant:

static WebPMuxError MuxGetCanvasInfo(const WebPMux* const mux,
                                     int* width, int* height, uint32_t* flags) {
  int w, h;
  uint32_t f = 0;
  WebPData data;
  assert(mux != NULL);

  // Check if VP8X chunk is present.
  if (MuxGet(mux, IDX_VP8X, 1, &data) == WEBP_MUX_OK) {
    if (data.size < VP8X_CHUNK_SIZE) return WEBP_MUX_BAD_DATA;
    f = GetLE32(data.bytes + 0);
    w = GetLE24(data.bytes + 4) + 1;
    h = GetLE24(data.bytes + 7) + 1;
  } else {
    const WebPMuxImage* const wpi = mux->images_;
    // Grab user-forced canvas size as default.
    w = mux->canvas_width_;
    h = mux->canvas_height_;
    if (w == 0 && h == 0 && ValidateForSingleImage(mux) == WEBP_MUX_OK) {
      // single image and not forced canvas size => use dimension of first frame
      assert(wpi != NULL);
      w = wpi->width_;
      h = wpi->height_;
    }
    if (wpi != NULL) {
      if (wpi->has_alpha_) f |= ALPHA_FLAG;
    }
  }
  if (w * (uint64_t)h >= MAX_IMAGE_AREA) return WEBP_MUX_BAD_DATA;

  if (width != NULL) *width = w;
  if (height != NULL) *height = h;
  if (flags != NULL) *flags = f;
  return WEBP_MUX_OK;
}